

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

StatusOr<unsigned_long> __thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseUInt<google::protobuf::json_internal::ParseProto2Descriptor>
          (anon_unknown_5 *this,JsonLexer *lex,
          Field<google::protobuf::json_internal::ParseProto2Descriptor> field)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  Status *x;
  LocationWith<unsigned_long> *pLVar4;
  anon_union_8_2_a3c22f61_for_StatusOrData<unsigned_long>_3 extraout_RDX;
  StatusOr<unsigned_long> SVar5;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  JsonLocation local_70;
  Status _status;
  StatusOr<google::protobuf::json_internal::LocationWith<unsigned_long>_> n;
  Field<google::protobuf::json_internal::ParseProto2Descriptor> field_local;
  JsonLexer *lex_local;
  
  ParseIntInner<unsigned_long>
            ((StatusOr<google::protobuf::json_internal::LocationWith<unsigned_long>_> *)&_status,lex
             ,0.0,18014398509481984.0);
  x = absl::lts_20240722::StatusOr<google::protobuf::json_internal::LocationWith<unsigned_long>_>::
      status((StatusOr<google::protobuf::json_internal::LocationWith<unsigned_long>_> *)&_status);
  absl::lts_20240722::Status::Status((Status *)&local_70.path,x);
  bVar2 = absl::lts_20240722::Status::ok((Status *)&local_70.path);
  bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
  if (bVar2) {
    absl::lts_20240722::StatusOr<unsigned_long>::StatusOr<const_absl::lts_20240722::Status,_0>
              ((StatusOr<unsigned_long> *)this,(Status *)&local_70.path);
  }
  local_70.line._0_4_ = (uint)bVar2;
  absl::lts_20240722::Status::~Status((Status *)&local_70.path);
  if ((uint)local_70.line == 0) {
    bVar2 = Proto2Descriptor::Is32Bit(field);
    if (bVar2) {
      pLVar4 = absl::lts_20240722::
               StatusOr<google::protobuf::json_internal::LocationWith<unsigned_long>_>::operator->
                         ((StatusOr<google::protobuf::json_internal::LocationWith<unsigned_long>_> *
                          )&_status);
      uVar1 = pLVar4->value;
      uVar3 = std::numeric_limits<unsigned_int>::max();
      if (uVar3 < uVar1) {
        pLVar4 = absl::lts_20240722::
                 StatusOr<google::protobuf::json_internal::LocationWith<unsigned_long>_>::operator->
                           ((StatusOr<google::protobuf::json_internal::LocationWith<unsigned_long>_>
                             *)&_status);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_80,"integer out of range");
        JsonLocation::SourceLocation::current();
        JsonLocation::Invalid(&local_70,&pLVar4->loc,local_80._M_len,local_80._M_str);
        absl::lts_20240722::StatusOr<unsigned_long>::StatusOr<absl::lts_20240722::Status,_0>
                  ((StatusOr<unsigned_long> *)this,(Status *)&local_70);
        absl::lts_20240722::Status::~Status((Status *)&local_70);
        local_70.line._0_4_ = 1;
        goto LAB_004b6256;
      }
    }
    pLVar4 = absl::lts_20240722::
             StatusOr<google::protobuf::json_internal::LocationWith<unsigned_long>_>::operator->
                       ((StatusOr<google::protobuf::json_internal::LocationWith<unsigned_long>_> *)
                        &_status);
    absl::lts_20240722::StatusOr<unsigned_long>::StatusOr<unsigned_long_&,_0>
              ((StatusOr<unsigned_long> *)this,&pLVar4->value);
    local_70.line._0_4_ = 1;
  }
LAB_004b6256:
  absl::lts_20240722::StatusOr<google::protobuf::json_internal::LocationWith<unsigned_long>_>::
  ~StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<unsigned_long>_> *)&_status);
  SVar5.super_StatusOrData<unsigned_long>.field_1.data_ = extraout_RDX.data_;
  SVar5.super_StatusOrData<unsigned_long>.field_0 =
       (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)this;
  return (StatusOr<unsigned_long>)SVar5.super_StatusOrData<unsigned_long>;
}

Assistant:

absl::StatusOr<uint64_t> ParseUInt(JsonLexer& lex, Field<Traits> field) {
  absl::StatusOr<LocationWith<uint64_t>> n =
      ParseIntInner<uint64_t>(lex, 0, 18014398509481984.0);
  RETURN_IF_ERROR(n.status());

  if (Traits::Is32Bit(field)) {
    if (n->value > std::numeric_limits<uint32_t>::max()) {
      return n->loc.Invalid("integer out of range");
    }
  }

  return n->value;
}